

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::Method::_InternalSerialize
          (Method *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  Method *pMVar1;
  bool bVar2;
  uint uVar3;
  int cached_size;
  Syntax SVar4;
  uint32_t *puVar5;
  ulong uVar6;
  WireFormatLite *pWVar7;
  RepeatedPtrField<google::protobuf::Option> *this_00;
  const_reference this_01;
  UnknownFieldSet *unknown_fields;
  char *in_R9;
  string_view sVar8;
  string_view field_name;
  string_view field_name_00;
  Option *repfield;
  uint n;
  uint i;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  string *local_88;
  string *_s_2;
  char *local_78;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  string *local_60;
  string *_s_1;
  char *local_50;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  string *local_38;
  string *_s;
  Method *pMStack_28;
  uint32_t cached_has_bits;
  Method *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  Method *this_local;
  
  _s._4_4_ = 0;
  pMStack_28 = this;
  this_ = (Method *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar5 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar5 & 1) != 0) {
    _internal_name_abi_cxx11_(pMStack_28);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      local_38 = _internal_name_abi_cxx11_(pMStack_28);
      pWVar7 = (WireFormatLite *)std::__cxx11::string::data();
      uVar3 = std::__cxx11::string::length();
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_48,"google.protobuf.Method.name");
      sVar8._M_str = in_R9;
      sVar8._M_len = (size_t)local_48._M_str;
      internal::WireFormatLite::VerifyUtf8String
                (pWVar7,(char *)(ulong)uVar3,1,(Operation)local_48._M_len,sVar8);
      pMVar1 = this_;
      sVar8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
      local_50 = sVar8._M_str;
      _s_1 = (string *)sVar8._M_len;
      stream_local = (EpsCopyOutputStream *)
                     protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                               ((EpsCopyOutputStream *)pMVar1,1,sVar8,(uint8_t *)stream_local);
    }
  }
  puVar5 = internal::HasBits<1>::operator[](&(pMStack_28->field_0)._impl_._has_bits_,0);
  if ((*puVar5 & 2) != 0) {
    _internal_request_type_url_abi_cxx11_(pMStack_28);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      local_60 = _internal_request_type_url_abi_cxx11_(pMStack_28);
      pWVar7 = (WireFormatLite *)std::__cxx11::string::data();
      uVar3 = std::__cxx11::string::length();
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_70,"google.protobuf.Method.request_type_url");
      field_name._M_str = in_R9;
      field_name._M_len = (size_t)local_70._M_str;
      internal::WireFormatLite::VerifyUtf8String
                (pWVar7,(char *)(ulong)uVar3,1,(Operation)local_70._M_len,field_name);
      pMVar1 = this_;
      sVar8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
      local_78 = sVar8._M_str;
      _s_2 = (string *)sVar8._M_len;
      stream_local = (EpsCopyOutputStream *)
                     protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                               ((EpsCopyOutputStream *)pMVar1,2,sVar8,(uint8_t *)stream_local);
    }
  }
  puVar5 = internal::HasBits<1>::operator[](&(pMStack_28->field_0)._impl_._has_bits_,0);
  if (((*puVar5 & 8) != 0) && (bVar2 = _internal_request_streaming(pMStack_28), bVar2)) {
    stream_local = (EpsCopyOutputStream *)
                   protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    bVar2 = _internal_request_streaming(pMStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteBoolToArray(3,bVar2,(uint8_t *)stream_local);
  }
  puVar5 = internal::HasBits<1>::operator[](&(pMStack_28->field_0)._impl_._has_bits_,0);
  if ((*puVar5 & 4) != 0) {
    _internal_response_type_url_abi_cxx11_(pMStack_28);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      local_88 = _internal_response_type_url_abi_cxx11_(pMStack_28);
      pWVar7 = (WireFormatLite *)std::__cxx11::string::data();
      uVar3 = std::__cxx11::string::length();
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_98,"google.protobuf.Method.response_type_url");
      field_name_00._M_str = in_R9;
      field_name_00._M_len = (size_t)local_98._M_str;
      internal::WireFormatLite::VerifyUtf8String
                (pWVar7,(char *)(ulong)uVar3,1,(Operation)local_98._M_len,field_name_00);
      pMVar1 = this_;
      sVar8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_88);
      stream_local = (EpsCopyOutputStream *)
                     protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                               ((EpsCopyOutputStream *)pMVar1,4,sVar8,(uint8_t *)stream_local);
    }
  }
  puVar5 = internal::HasBits<1>::operator[](&(pMStack_28->field_0)._impl_._has_bits_,0);
  if (((*puVar5 & 0x10) != 0) && (bVar2 = _internal_response_streaming(pMStack_28), bVar2)) {
    stream_local = (EpsCopyOutputStream *)
                   protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    bVar2 = _internal_response_streaming(pMStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteBoolToArray(5,bVar2,(uint8_t *)stream_local);
  }
  repfield._4_4_ = 0;
  uVar3 = _internal_options_size(pMStack_28);
  for (; repfield._4_4_ < uVar3; repfield._4_4_ = repfield._4_4_ + 1) {
    this_00 = _internal_options(pMStack_28);
    this_01 = RepeatedPtrField<google::protobuf::Option>::Get(this_00,repfield._4_4_);
    cached_size = Option::GetCachedSize(this_01);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (6,(MessageLite *)this_01,cached_size,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  puVar5 = internal::HasBits<1>::operator[](&(pMStack_28->field_0)._impl_._has_bits_,0);
  if (((*puVar5 & 0x20) != 0) && (SVar4 = _internal_syntax(pMStack_28), SVar4 != SYNTAX_PROTO2)) {
    stream_local = (EpsCopyOutputStream *)
                   protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    SVar4 = _internal_syntax(pMStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteEnumToArray(7,SVar4,(uint8_t *)stream_local);
  }
  bVar2 = internal::InternalMetadata::have_unknown_fields
                    (&(pMStack_28->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pMStack_28->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL Method::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const Method& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.Method)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // string name = 1;
  if ((this_._impl_._has_bits_[0] & 0x00000001u) != 0) {
    if (!this_._internal_name().empty()) {
      const ::std::string& _s = this_._internal_name();
      ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.Method.name");
      target = stream->WriteStringMaybeAliased(1, _s, target);
    }
  }

  // string request_type_url = 2;
  if ((this_._impl_._has_bits_[0] & 0x00000002u) != 0) {
    if (!this_._internal_request_type_url().empty()) {
      const ::std::string& _s = this_._internal_request_type_url();
      ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.Method.request_type_url");
      target = stream->WriteStringMaybeAliased(2, _s, target);
    }
  }

  // bool request_streaming = 3;
  if ((this_._impl_._has_bits_[0] & 0x00000008u) != 0) {
    if (this_._internal_request_streaming() != 0) {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteBoolToArray(
          3, this_._internal_request_streaming(), target);
    }
  }

  // string response_type_url = 4;
  if ((this_._impl_._has_bits_[0] & 0x00000004u) != 0) {
    if (!this_._internal_response_type_url().empty()) {
      const ::std::string& _s = this_._internal_response_type_url();
      ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.Method.response_type_url");
      target = stream->WriteStringMaybeAliased(4, _s, target);
    }
  }

  // bool response_streaming = 5;
  if ((this_._impl_._has_bits_[0] & 0x00000010u) != 0) {
    if (this_._internal_response_streaming() != 0) {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteBoolToArray(
          5, this_._internal_response_streaming(), target);
    }
  }

  // repeated .google.protobuf.Option options = 6;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_options_size());
       i < n; i++) {
    const auto& repfield = this_._internal_options().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            6, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // .google.protobuf.Syntax syntax = 7;
  if ((this_._impl_._has_bits_[0] & 0x00000020u) != 0) {
    if (this_._internal_syntax() != 0) {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteEnumToArray(
          7, this_._internal_syntax(), target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.Method)
  return target;
}